

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall ProcessedToken::ProcessedToken(ProcessedToken *this,ProcessedToken *t)

{
  ProcessedTokenType PVar1;
  
  PVar1 = t->type;
  this->type = PVar1;
  switch(PVar1) {
  case SECID:
  case COMP:
  case SOSTYPE:
    (this->field_1).keyword = (t->field_1).keyword;
    break;
  case VARID:
  case CONID:
    this->field_1 = t->field_1;
    break;
  case CONST:
    this->field_1 = t->field_1;
  }
  t->type = NONE;
  return;
}

Assistant:

ProcessedToken(ProcessedToken&& t) : type(t.type) {
    switch (type) {
      case ProcessedTokenType::SECID:
        keyword = t.keyword;
        break;
      case ProcessedTokenType::SOSTYPE:
        sostype = t.sostype;
        break;
      case ProcessedTokenType::CONID:
      case ProcessedTokenType::VARID:
        name = t.name;
        break;
      case ProcessedTokenType::CONST:
        value = t.value;
        break;
      case ProcessedTokenType::COMP:
        dir = t.dir;
        break;
      default:;
    }
    t.type = ProcessedTokenType::NONE;
  }